

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O2

void grd_free(grd_t *grd)

{
  uint uVar1;
  uint32_t w;
  ulong uVar2;
  
  uVar1 = grd->mdl->opt->nthread;
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    grd_stfree(grd->grd_st[uVar2]);
  }
  free(grd->grd_st);
  free(grd);
  return;
}

Assistant:

void grd_free(grd_t *grd) {
	const uint32_t W = grd->mdl->opt->nthread;
#ifdef ATM_ANSI
	for (uint32_t w = 1; w < W; w++)
		xvm_free(grd->grd_st[w]->g);
#endif
	for (uint32_t w = 0; w < W; w++)
		grd_stfree(grd->grd_st[w]);
	free(grd->grd_st);
	free(grd);
}